

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O0

void replace_refs_in_line
               (string *line,string *pattern_in,string *pattern_out,label_idx_map *labels,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *refs,size_t line_no,bool ignore_comments)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  mapped_type *__val;
  string *psVar8;
  string *in_RDI;
  undefined8 in_R8;
  ulong in_R9;
  byte in_stack_00000008;
  string new_ref;
  const_iterator found;
  string ref;
  size_type count;
  size_type start_replace;
  size_type end;
  size_type start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t pos_comment;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  key_type *in_stack_fffffffffffffea8;
  ostream *in_stack_fffffffffffffeb0;
  ulong local_108;
  string local_100 [32];
  string local_e0 [32];
  _Self local_c0 [3];
  _Self local_a8;
  string local_a0 [32];
  string *local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  reference local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  undefined8 local_48;
  ulong local_40;
  byte local_31;
  ulong local_30;
  undefined8 local_28;
  string *local_8;
  
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_8 = in_RDI;
  if (local_31 == 0) {
    local_108 = std::__cxx11::string::size();
  }
  else {
    local_108 = std::__cxx11::string::find((char)in_RDI,0x25);
  }
  local_40 = local_108;
  local_48 = local_28;
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe88);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe88);
  do {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar4) {
      return;
    }
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_50);
    local_70 = 0;
    while ((local_68 = std::__cxx11::string::find(local_8,(ulong)local_60),
           local_68 != 0xffffffffffffffff && (local_68 <= local_40))) {
      local_70 = std::__cxx11::string::find((char)local_8,0x7d);
      uVar2 = local_68;
      if (local_70 == -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"PARSING ERROR: No matching \'}\'");
        poVar6 = std::operator<<(poVar6," on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_30);
        std::operator<<(poVar6,'\n');
        exit(1);
      }
      lVar7 = std::__cxx11::string::size();
      uVar3 = local_68;
      lVar1 = local_70;
      local_78 = uVar2 + lVar7;
      lVar7 = std::__cxx11::string::size();
      local_80 = (string *)(lVar1 - (uVar3 + lVar7));
      std::__cxx11::string::substr((ulong)local_a0,(ulong)local_8);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::find(in_stack_fffffffffffffe88,(key_type *)0x10650e);
      local_c0[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end(in_stack_fffffffffffffe88);
      bVar4 = std::operator!=(&local_a8,local_c0);
      if (bVar4) {
        __val = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        std::__cxx11::to_string((unsigned_long)__val);
        std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::replace((ulong)local_8,local_78,local_80);
        std::__cxx11::string::~string(local_e0);
      }
      else {
        psVar8 = (string *)std::__cxx11::string::size();
        iVar5 = std::__cxx11::string::compare((ulong)local_a0,0,psVar8);
        if (iVar5 == 0) {
          in_stack_fffffffffffffeb0 =
               std::operator<<((ostream *)&std::cerr,"PARSING WARNING: Undefined ");
          in_stack_fffffffffffffea8 =
               (key_type *)std::operator<<(in_stack_fffffffffffffeb0,(string *)local_60);
          poVar6 = std::operator<<((ostream *)in_stack_fffffffffffffea8,local_a0);
          in_stack_fffffffffffffe98 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<(poVar6,"} on line ");
          in_stack_fffffffffffffe90 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::ostream::operator<<(in_stack_fffffffffffffe98,local_30);
          std::operator<<((ostream *)in_stack_fffffffffffffe90,'\n');
        }
      }
      std::__cxx11::string::~string(local_a0);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

void replace_refs_in_line(std::string& line, const std::string& pattern_in,
                          const std::string& pattern_out,
                          const label_idx_map& labels,
                          const std::vector<std::string>& refs,
                          std::size_t line_no, bool ignore_comments) {
    std::size_t pos_comment = ignore_comments ? line.find('%') : line.size();
    // for all reference types
    for (auto&& elem : refs) {
        std::string::size_type start;
        std::string::size_type end = 0;
        while (true) {
            start = line.find(elem, end);
            if (start == std::string::npos || start > pos_comment) {
                break;
            }
            end = line.find('}', start);
            if (end == std::string::npos) {
                std::cerr << "PARSING ERROR: No matching '}'" << " on line "
                          << line_no << '\n';
                std::exit(EXIT_FAILURE);
            }

            auto start_replace = start + elem.size();
            auto count = end - (start + elem.size());
            std::string ref = line.substr(start_replace, count);
            auto found = labels.find(ref);
            if (found != labels.end()) {
                // construct the new reference
                std::string new_ref =
                    pattern_out + std::to_string(labels.at(ref));
                line.replace(start_replace, count, new_ref);
            }
            // the reference starts with pattern_in but it is not in the labels
            // map
            else if (ref.compare(0, pattern_in.size(), pattern_in) == 0) {
                std::cerr << "PARSING WARNING: Undefined " << elem << ref
                          << "} on line " << line_no << '\n';
            }
        }
    }
}